

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_token * fy_document_tag_directive_lookup(fy_document *fyd,char *handle)

{
  int iVar1;
  size_t __n;
  size_t len;
  size_t h_size;
  char *h;
  void *iter;
  fy_token *fyt;
  char *handle_local;
  fy_document *fyd_local;
  
  if ((fyd == (fy_document *)0x0) || (handle == (char *)0x0)) {
    fyd_local = (fy_document *)0x0;
  }
  else {
    fyt = (fy_token *)handle;
    handle_local = (char *)fyd;
    __n = strlen(handle);
    h = (char *)0x0;
    do {
      iter = fy_document_tag_directive_iterate((fy_document *)handle_local,&h);
      if ((fy_token *)iter == (fy_token *)0x0) {
        return (fy_token *)0x0;
      }
      h_size = (size_t)fy_tag_directive_token_handle((fy_token *)iter,&len);
    } while ((((char *)h_size == (char *)0x0) || (len != __n)) ||
            (iVar1 = memcmp((void *)h_size,fyt,__n), iVar1 != 0));
    fyd_local = (fy_document *)iter;
  }
  return (fy_token *)fyd_local;
}

Assistant:

struct fy_token *fy_document_tag_directive_lookup(struct fy_document *fyd, const char *handle) {
    struct fy_token *fyt;
    void *iter;
    const char *h;
    size_t h_size, len;

    if (!fyd || !handle)
        return NULL;
    len = strlen(handle);

    iter = NULL;
    while ((fyt = fy_document_tag_directive_iterate(fyd, &iter)) != NULL) {
        h = fy_tag_directive_token_handle(fyt, &h_size);
        if (!h)
            continue;
        if (h_size == len && !memcmp(h, handle, len))
            return fyt;
    }
    return NULL;
}